

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O3

void NuttallWindow(int y_length,double *y)

{
  ulong uVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  
  if (0 < y_length) {
    uVar1 = 0;
    do {
      dVar2 = (double)(int)uVar1 / (double)(y_length + -1);
      dVar3 = cos(dVar2 * 6.283185307179586);
      dVar4 = cos(dVar2 * 12.566370614359172);
      dVar2 = cos(dVar2 * 18.84955592153876);
      y[uVar1] = dVar2 * -0.012604 + dVar4 * 0.144232 + dVar3 * -0.487396 + 0.355768;
      uVar1 = uVar1 + 1;
    } while ((uint)y_length != uVar1);
  }
  return;
}

Assistant:

void NuttallWindow(int y_length, double *y) {
  double tmp;
  for (int i = 0; i < y_length; ++i) {
    tmp  = i / (y_length - 1.0);
    y[i] = 0.355768 - 0.487396 * cos(2.0 * world::kPi * tmp) +
      0.144232 * cos(4.0 * world::kPi * tmp) -
      0.012604 * cos(6.0 * world::kPi * tmp);
  }
}